

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.h
# Opt level: O2

int edata_cmp_summary_comp(edata_cmp_summary_t a,edata_cmp_summary_t b)

{
  return ((uint)(b.addr < a.addr) - (uint)(a.addr < b.addr)) +
         ((uint)(b.sn < a.sn) - (uint)(a.sn < b.sn)) * 2;
}

Assistant:

static inline int
edata_cmp_summary_comp(edata_cmp_summary_t a, edata_cmp_summary_t b) {
	/*
	 * Logically, what we're doing here is comparing based on `.sn`, and
	 * falling back to comparing on `.addr` in the case that `a.sn == b.sn`.
	 * We accomplish this by multiplying the result of the `.sn` comparison
	 * by 2, so that so long as it is not 0, it will dominate the `.addr`
	 * comparison in determining the sign of the returned result value.
	 * The justification for doing things this way is that this is
	 * branchless - all of the branches that would be present in a
	 * straightforward implementation are common cases, and thus the branch
	 * prediction accuracy is not great. As a result, this implementation
	 * is measurably faster (by around 30%).
	 */
	return (2 * ((a.sn > b.sn) - (a.sn < b.sn))) +
	       ((a.addr > b.addr) - (a.addr < b.addr));
}